

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O0

void __thiscall
deqp::gls::StateChangePerformanceCase::~StateChangePerformanceCase(StateChangePerformanceCase *this)

{
  code *pcVar1;
  StateChangePerformanceCase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

StateChangePerformanceCase::~StateChangePerformanceCase (void)
{
	StateChangePerformanceCase::deinit();
}